

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

bool * __thiscall
SmallDenseMap<unsigned_long,_bool,_PointerHasher,_1024U>::find
          (SmallDenseMap<unsigned_long,_bool,_PointerHasher,_1024U> *this,unsigned_long *key)

{
  char acVar1 [8];
  char acVar2 [8];
  uint i;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char data [8];
  
  uVar4 = this->bucketCount;
  acVar1 = (char  [8])*key;
  data[0] = acVar1[0];
  data[1] = acVar1[1];
  data[2] = acVar1[2];
  data[3] = acVar1[3];
  data[4] = acVar1[4];
  data[5] = acVar1[5];
  data[6] = acVar1[6];
  data[7] = acVar1[7];
  uVar5 = 0x1505;
  lVar3 = 0;
  do {
    uVar5 = (int)data[lVar3] + uVar5 * 0x21;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  uVar6 = uVar4 - 1;
  if (uVar4 != 0) {
    iVar7 = 0;
    do {
      uVar5 = uVar5 & uVar6;
      acVar2 = (char  [8])this->data[uVar5].key;
      if (acVar2 == (char  [8])0x0) {
        return (bool *)0x0;
      }
      if (acVar2 == acVar1) {
        return &this->data[uVar5].value;
      }
      uVar5 = uVar5 + iVar7 + 1;
      iVar7 = iVar7 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return (bool *)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}